

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

QVariant * __thiscall
QGraphicsScene::inputMethodQuery
          (QVariant *__return_storage_ptr__,QGraphicsScene *this,InputMethodQuery query)

{
  long lVar1;
  long lVar2;
  qreal qVar3;
  GraphicsItemFlags GVar4;
  int iVar5;
  QPoint QVar6;
  long lVar7;
  qreal *pqVar8;
  QTransform *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  QPointF QVar11;
  QRect QVar12;
  undefined1 local_b8 [32];
  QVariant local_98;
  QTransform matrix;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if (*(QGraphicsItem **)(lVar2 + 0x188) != (QGraphicsItem *)0x0) {
    GVar4 = QGraphicsItem::flags(*(QGraphicsItem **)(lVar2 + 0x188));
    if (((uint)GVar4.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
               super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 0xc & 1) != 0) {
      pqVar8 = (qreal *)&DAT_006795c0;
      pQVar9 = &matrix;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pQVar9->m_matrix[0][0] = *pqVar8;
        pqVar8 = pqVar8 + (ulong)bVar10 * -2 + 1;
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      QGraphicsItem::sceneTransform(&matrix,*(QGraphicsItem **)(lVar2 + 0x188));
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0x14) = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).field_0x18 = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).field_0x1c = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).data = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 4) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 8) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0xc) = 0xaaaaaaaa;
      (**(code **)(**(long **)(lVar2 + 0x188) + 0x100))
                (__return_storage_ptr__,*(long **)(lVar2 + 0x188),query);
      iVar5 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar5 == 0x14) {
        ::QVariant::toRectF();
        pQVar9 = &matrix;
        QTransform::mapRect((QRectF *)local_b8);
        ::QVariant::QVariant(&local_98,(QRectF *)pQVar9);
      }
      else {
        iVar5 = ::QVariant::typeId(__return_storage_ptr__);
        if (iVar5 == 0x1a) {
          ::QVariant::toPointF();
          qVar3 = (qreal)QTransform::map((QPointF *)&matrix);
          QVar11.yp._4_4_ = in_XMM1_Db;
          QVar11.yp._0_4_ = in_XMM1_Da;
          QVar11.xp = qVar3;
          ::QVariant::QVariant(&local_98,QVar11);
        }
        else {
          iVar5 = ::QVariant::typeId(__return_storage_ptr__);
          if (iVar5 == 0x13) {
            ::QVariant::toRect();
            QVar12 = (QRect)QTransform::mapRect((QRect *)&matrix);
            ::QVariant::QVariant(&local_98,QVar12);
          }
          else {
            iVar5 = ::QVariant::typeId(__return_storage_ptr__);
            if (iVar5 != 0x19) goto LAB_00598a77;
            ::QVariant::toPoint();
            QVar6 = (QPoint)QTransform::map((QPoint *)&matrix);
            ::QVariant::QVariant(&local_98,QVar6);
          }
        }
      }
      ::QVariant::operator=(__return_storage_ptr__,&local_98);
      ::QVariant::~QVariant(&local_98);
      goto LAB_00598a77;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00598a77:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsScene::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsScene);
    if (!d->focusItem || !(d->focusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod))
        return QVariant();
    const QTransform matrix = d->focusItem->sceneTransform();
    QVariant value = d->focusItem->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = matrix.mapRect(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = matrix.map(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = matrix.mapRect(value.toRect());
    else if (value.userType() == QMetaType::QPoint)
        value = matrix.map(value.toPoint());
    return value;
}